

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O2

void calc_adj(void)

{
  int ***pppiVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int j;
  long lVar7;
  int j_1;
  long lVar8;
  int i;
  
  iVar2 = bsize;
  for (lVar4 = 1; pppiVar1 = adj, lVar8 = 1, lVar4 <= iVar2; lVar4 = lVar4 + 1) {
    for (; lVar8 <= iVar2; lVar8 = lVar8 + 1) {
      pppiVar1[1][lVar4][lVar8] = 0;
      (*pppiVar1)[lVar4][lVar8] = 0;
      iVar2 = bsize;
    }
  }
  for (lVar4 = 1; lVar4 <= iVar2; lVar4 = lVar4 + 1) {
    lVar5 = 0;
    for (lVar8 = 1; lVar8 <= iVar2; lVar8 = lVar8 + 1) {
      if (board[lVar4][lVar8] == '\0') {
        iVar6 = 0;
        for (lVar3 = -1; iVar2 = bsize, lVar3 != 2; lVar3 = lVar3 + 1) {
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            if ((((int)lVar7 + iVar6 & 1U) != 0) && ('\x01' < board[lVar3 + lVar4][lVar7 + lVar5]))
            {
              iVar2 = score_word((int)lVar4,(int)lVar8,lVar7 != 1,true,true);
              adj[lVar3 * lVar3][lVar4][lVar8] = iVar2;
            }
          }
          iVar6 = iVar6 + 1;
        }
      }
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

void calc_adj() {
    for (int i = 1; i <= bsize; i++)
        for (int j = 1; j <= bsize; j++)
            adj[0][i][j] = adj[1][i][j] = 0;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) {
                for (int ii = -1; ii <= 1; ii++) {
                    for (int jj = -1; jj <= 1; jj++) {
                        if ((ii + jj) % 2 && board[i + ii][j + jj] > 1) {
                            //board[i][j]='A'+26; // dummy character to discount ij
                            adj[ii * ii][i][j] = score_word(i, j, jj != 0, true, true);
                            //board[i][j]=0;
                        }
                    }
                }
            }
        }
    }
}